

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_ProfiledLdLen<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
          (InterpreterStackFrame *this,
          OpLayoutDynamicProfile<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>_>
          *playout)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  ImplicitCallFlags flags;
  PropertyId propertyId_00;
  undefined4 *puVar4;
  DynamicProfileInfo *this_00;
  ScriptContext *this_01;
  ThreadContext *this_02;
  InlineCache *inlineCache;
  FunctionBody *pFVar5;
  Var pvVar6;
  Var value;
  PropertyId propertyId;
  ImplicitCallFlags savedImplicitCallFlags;
  ThreadContext *threadContext;
  Var pvStack_30;
  LdLenInfo ldLenInfo;
  Var instance;
  DynamicProfileInfo *profileData;
  FunctionBody *functionBody;
  OpLayoutDynamicProfile<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>_>
  *playout_local;
  InterpreterStackFrame *this_local;
  
  if (playout ==
      (OpLayoutDynamicProfile<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>_> *)
      0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x2203,"(playout)","playout");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pFVar5 = *(FunctionBody **)(this + 0x88);
  this_00 = FunctionBody::GetDynamicProfileInfo(pFVar5);
  pvStack_30 = GetReg<unsigned_char>
                         (this,(playout->
                               super_OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>).
                               Instance);
  LdLenInfo::LdLenInfo((LdLenInfo *)((long)&threadContext + 4));
  threadContext._2_2_ =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       ValueType::Merge(&ValueType::Uninitialized,pvStack_30);
  threadContext._4_2_ = threadContext._2_2_;
  bVar3 = TestFlags(this,0x80);
  if (bVar3) {
    threadContext._6_1_ = threadContext._6_1_ & 0xfe | 1;
    ClearFlags(this,0x80);
  }
  DynamicProfileInfo::RecordLengthLoad
            (this_00,pFVar5,playout->profileId,(LdLenInfo *)((long)&threadContext + 4));
  this_01 = GetScriptContext(this);
  this_02 = ScriptContext::GetThreadContext(this_01);
  flags = ThreadContext::GetImplicitCallFlags(this_02);
  ThreadContext::ClearImplicitCallFlags(this_02);
  propertyId_00 =
       GetPropertyIdFromCacheId
                 (this,(uint)(playout->
                             super_OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>).
                             inlineCacheIndex);
  pvVar6 = pvStack_30;
  inlineCache = GetInlineCache(this,(uint)(playout->
                                          super_OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>
                                          ).inlineCacheIndex);
  bVar1 = (playout->super_OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>).
          inlineCacheIndex;
  pFVar5 = GetFunctionBody(this);
  pvVar6 = ProfilingHelpers::ProfiledLdFld<false,false,false>
                     (pvVar6,propertyId_00,inlineCache,(uint)bVar1,pFVar5,pvStack_30);
  SetReg<unsigned_char>
            (this,(playout->super_OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>).
                  Value,pvVar6);
  ThreadContext::CheckAndResetImplicitCallAccessorFlag(this_02);
  ThreadContext::AddImplicitCallFlags(this_02,flags);
  return;
}

Assistant:

void InterpreterStackFrame::OP_ProfiledLdLen(const unaligned OpLayoutDynamicProfile<T> *const playout)
    {
        Assert(playout);
        FunctionBody * functionBody = m_functionBody;
        DynamicProfileInfo * profileData = functionBody->GetDynamicProfileInfo();

        Var instance = GetReg(playout->Instance);

        LdLenInfo ldLenInfo;
        ldLenInfo.arrayType = ValueType::Uninitialized.Merge(instance);

        if (this->TestFlags(InterpreterStackFrameFlags_ProcessingBailOutOnArraySpecialization))
        {
            ldLenInfo.disableAggressiveSpecialization = true;
            this->ClearFlags(InterpreterStackFrameFlags_ProcessingBailOutOnArraySpecialization);
        }

        profileData->RecordLengthLoad(functionBody, playout->profileId, ldLenInfo);

        ThreadContext* threadContext = this->GetScriptContext()->GetThreadContext();
        ImplicitCallFlags savedImplicitCallFlags = threadContext->GetImplicitCallFlags();
        threadContext->ClearImplicitCallFlags();

        PropertyId propertyId = GetPropertyIdFromCacheId(playout->inlineCacheIndex);
        Var value = ProfilingHelpers::ProfiledLdFld<false, false, false>(
            instance,
            propertyId,
            GetInlineCache(playout->inlineCacheIndex),
            playout->inlineCacheIndex,
            GetFunctionBody(),
            instance);

        SetReg(playout->Value, value);

        threadContext->CheckAndResetImplicitCallAccessorFlag();
        threadContext->AddImplicitCallFlags(savedImplicitCallFlags);
    }